

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

bool __thiscall PPointer::ReadValue(PPointer *this,FArchive *ar,void *addr)

{
  bool bVar1;
  byte local_29;
  DObject **ppDStack_28;
  BYTE tag;
  void *addr_local;
  FArchive *ar_local;
  PPointer *this_local;
  
  ppDStack_28 = (DObject **)addr;
  addr_local = ar;
  ar_local = (FArchive *)this;
  FArchive::operator<<(ar,&local_29);
  if ((local_29 == 0x10) &&
     (bVar1 = DObject::IsKindOf(&this->PointedType->super_DObject,PClass::RegistrationInfo.MyClass),
     bVar1)) {
    FArchive::operator<<((FArchive *)addr_local,ppDStack_28);
    this_local._7_1_ = true;
  }
  else {
    PType::SkipValue((FArchive *)addr_local,(uint)local_29);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool PPointer::ReadValue(FArchive &ar, void *addr) const
{
	BYTE tag;
	ar << tag;
	if (tag == VAL_Object && PointedType->IsKindOf(RUNTIME_CLASS(PClass)))
	{
		ar << *(DObject **)addr;
		return true;
	}
	SkipValue(ar, tag);
	return false;
}